

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringalgorithms_p.h
# Opt level: O2

QString * QStringAlgorithms<QString>::trimmed_helper(QString *__return_storage_ptr__,QString *str)

{
  QChar *pQVar1;
  Data *pDVar2;
  QChar *unicode;
  Char *end;
  TrimPositions TVar3;
  
  TVar3 = trimmed_helper_positions(str);
  end = TVar3.end;
  unicode = TVar3.begin;
  pQVar1 = (QChar *)(str->d).ptr;
  if ((unicode == pQVar1) && (end == pQVar1 + (str->d).size)) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&str->d);
  }
  else {
    pDVar2 = (str->d).d;
    if ((pDVar2 == (Data *)0x0) ||
       ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 1)) {
      QString::QString(__return_storage_ptr__,unicode,(long)end - (long)unicode >> 1);
    }
    else {
      trimmed_helper_inplace(__return_storage_ptr__,str,unicode,end);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static inline StringType trimmed_helper(StringType &str)
    {
        const auto [begin, end] = trimmed_helper_positions(str);
        if (begin == str.cbegin() && end == str.cend())
            return str;
        if (!isConst && str.isDetached())
            return trimmed_helper_inplace(str, begin, end);
        return StringType(begin, end - begin);
    }